

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

int mg_value_equal(mg_value *lhs,mg_value *rhs)

{
  int iVar1;
  mg_relationship *lhs_00;
  mg_path *in_RSI;
  uint *in_RDI;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar2;
  uint local_4;
  
  if (*in_RDI == in_RSI->node_count) {
    lhs_00 = (mg_relationship *)(ulong)*in_RDI;
    switch(lhs_00) {
    case (mg_relationship *)0x0:
      local_4 = 1;
      break;
    case (mg_relationship *)0x1:
      local_4 = (uint)((in_RDI[2] == 0) == (in_RSI->sequence_length == 0));
      break;
    case (mg_relationship *)0x2:
      local_4 = (uint)(*(long *)(in_RDI + 2) == *(long *)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0x3:
      local_4 = (uint)(*(long *)(in_RDI + 2) == *(long *)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0x4:
      local_4 = mg_string_equal((mg_string *)lhs_00,(mg_string *)0x111194);
      break;
    case (mg_relationship *)0x5:
      if (**(int **)(in_RDI + 2) == **(int **)&in_RSI->sequence_length) {
        for (uVar2 = 0; uVar2 < **(uint **)(in_RDI + 2); uVar2 = uVar2 + 1) {
          iVar1 = mg_value_equal((mg_value *)in_RSI,
                                 (mg_value *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
          if (iVar1 == 0) {
            return 0;
          }
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
      break;
    case (mg_relationship *)0x6:
      local_4 = mg_map_equal((mg_map *)in_RSI,
                             (mg_map *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                            );
      break;
    case (mg_relationship *)0x7:
      local_4 = mg_node_equal((mg_node *)in_RSI,
                              (mg_node *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      break;
    case (mg_relationship *)0x8:
      local_4 = mg_relationship_equal(lhs_00,(mg_relationship *)0x11128f);
      break;
    case (mg_relationship *)0x9:
      local_4 = mg_unbound_relationship_equal
                          ((mg_unbound_relationship *)lhs_00,(mg_unbound_relationship *)0x1112af);
      break;
    case (mg_relationship *)0xa:
      local_4 = mg_path_equal(in_RSI,(mg_path *)
                                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      break;
    case (mg_relationship *)0xb:
      local_4 = mg_date_equal(*(mg_date **)(in_RDI + 2),*(mg_date **)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0xc:
      local_4 = mg_time_equal(*(mg_time **)(in_RDI + 2),*(mg_time **)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0xd:
      local_4 = mg_local_time_equal(*(mg_local_time **)(in_RDI + 2),
                                    *(mg_local_time **)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0xe:
      local_4 = mg_date_time_equal(*(mg_date_time **)(in_RDI + 2),
                                   *(mg_date_time **)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0xf:
      local_4 = mg_date_time_zone_id_equal
                          (*(mg_date_time_zone_id **)(in_RDI + 2),
                           *(mg_date_time_zone_id **)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0x10:
      local_4 = mg_local_date_time_equal
                          (*(mg_local_date_time **)(in_RDI + 2),
                           *(mg_local_date_time **)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0x11:
      local_4 = mg_duration_equal(*(mg_duration **)(in_RDI + 2),
                                  *(mg_duration **)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0x12:
      local_4 = mg_point_2d_equal(*(mg_point_2d **)(in_RDI + 2),
                                  *(mg_point_2d **)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0x13:
      local_4 = mg_point_3d_equal(*(mg_point_3d **)(in_RDI + 2),
                                  *(mg_point_3d **)&in_RSI->sequence_length);
      break;
    case (mg_relationship *)0x14:
      local_4 = 0;
      break;
    default:
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mg_value_equal(const mg_value *lhs, const mg_value *rhs) {
  if (lhs->type != rhs->type) {
    return 0;
  }
  switch (lhs->type) {
    case MG_VALUE_TYPE_NULL:
      return 1;

    case MG_VALUE_TYPE_BOOL:
      return (lhs->bool_v == 0) == (rhs->bool_v == 0);

    case MG_VALUE_TYPE_INTEGER:
      return lhs->integer_v == rhs->integer_v;

    case MG_VALUE_TYPE_FLOAT:
      return lhs->integer_v == rhs->integer_v;

    case MG_VALUE_TYPE_STRING:
      return mg_string_equal(lhs->string_v, rhs->string_v);
    case MG_VALUE_TYPE_LIST:
      if (lhs->list_v->size != rhs->list_v->size) {
        return 0;
      }
      for (uint32_t i = 0; i < lhs->list_v->size; ++i) {
        if (!mg_value_equal(lhs->list_v->elements[i], rhs->list_v->elements[i]))
          return 0;
      }
      return 1;
    case MG_VALUE_TYPE_MAP:
      return mg_map_equal(lhs->map_v, rhs->map_v);
    case MG_VALUE_TYPE_NODE:
      return mg_node_equal(lhs->node_v, rhs->node_v);
    case MG_VALUE_TYPE_RELATIONSHIP:
      return mg_relationship_equal(lhs->relationship_v, rhs->relationship_v);
    case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
      return mg_unbound_relationship_equal(lhs->unbound_relationship_v,
                                           rhs->unbound_relationship_v);
    case MG_VALUE_TYPE_PATH:
      return mg_path_equal(lhs->path_v, rhs->path_v);
    case MG_VALUE_TYPE_DATE:
      return mg_date_equal(lhs->date_v, rhs->date_v);
    case MG_VALUE_TYPE_TIME:
      return mg_time_equal(lhs->time_v, rhs->time_v);
    case MG_VALUE_TYPE_LOCAL_TIME:
      return mg_local_time_equal(lhs->local_time_v, rhs->local_time_v);
    case MG_VALUE_TYPE_DATE_TIME:
      return mg_date_time_equal(lhs->date_time_v, rhs->date_time_v);
    case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
      return mg_date_time_zone_id_equal(lhs->date_time_zone_id_v,
                                        rhs->date_time_zone_id_v);
    case MG_VALUE_TYPE_LOCAL_DATE_TIME:
      return mg_local_date_time_equal(lhs->local_date_time_v,
                                      rhs->local_date_time_v);
    case MG_VALUE_TYPE_DURATION:
      return mg_duration_equal(lhs->duration_v, rhs->duration_v);
    case MG_VALUE_TYPE_POINT_2D:
      return mg_point_2d_equal(lhs->point_2d_v, rhs->point_2d_v);
    case MG_VALUE_TYPE_POINT_3D:
      return mg_point_3d_equal(lhs->point_3d_v, rhs->point_3d_v);
    case MG_VALUE_TYPE_UNKNOWN:
      return 0;
  }
  return 0;
}